

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall Array<unsigned_int>::reserve(Array<unsigned_int> *this,usize size)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  ulong uVar5;
  uint *puVar6;
  
  if (size <= this->_capacity) {
    if (size == 0) {
      return;
    }
    if ((this->_begin).item != (uint *)0x0) {
      return;
    }
    if (size <= this->_capacity) goto LAB_00104eef;
  }
  this->_capacity = size;
LAB_00104eef:
  uVar5 = this->_capacity | 3;
  this->_capacity = uVar5;
  puVar3 = (uint *)operator_new__(uVar5 << 2);
  puVar1 = (this->_begin).item;
  puVar6 = puVar3;
  if (puVar1 != (uint *)0x0) {
    puVar2 = (this->_end).item;
    for (puVar4 = puVar1; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      *puVar6 = *puVar4;
      puVar6 = puVar6 + 1;
    }
    operator_delete__(puVar1);
  }
  (this->_begin).item = puVar3;
  (this->_end).item = puVar6;
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }